

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
::destroyAll(DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
             *this)

{
  bool bVar1;
  uint uVar2;
  DenseMapPair<unsigned_long,_unsigned_long> *pDVar3;
  unsigned_long *puVar4;
  DenseMapPair<unsigned_long,_unsigned_long> *E;
  DenseMapPair<unsigned_long,_unsigned_long> *P;
  unsigned_long TombstoneKey;
  unsigned_long EmptyKey;
  DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  *this_local;
  
  EmptyKey = (unsigned_long)this;
  uVar2 = getNumBuckets(this);
  if (uVar2 != 0) {
    TombstoneKey = getEmptyKey();
    P = (DenseMapPair<unsigned_long,_unsigned_long> *)getTombstoneKey();
    E = getBuckets(this);
    pDVar3 = getBucketsEnd(this);
    for (; E != pDVar3; E = E + 1) {
      puVar4 = detail::DenseMapPair<unsigned_long,_unsigned_long>::getFirst(E);
      bVar1 = DenseMapInfo<unsigned_long>::isEqual(puVar4,&TombstoneKey);
      if (!bVar1) {
        puVar4 = detail::DenseMapPair<unsigned_long,_unsigned_long>::getFirst(E);
        bVar1 = DenseMapInfo<unsigned_long>::isEqual(puVar4,(unsigned_long *)&P);
        if (!bVar1) {
          detail::DenseMapPair<unsigned_long,_unsigned_long>::getSecond(E);
        }
      }
      detail::DenseMapPair<unsigned_long,_unsigned_long>::getFirst(E);
    }
  }
  return;
}

Assistant:

void destroyAll() {
    if (getNumBuckets() == 0) // Nothing to do.
      return;

    const KeyT EmptyKey = getEmptyKey(), TombstoneKey = getTombstoneKey();
    for (BucketT *P = getBuckets(), *E = getBucketsEnd(); P != E; ++P) {
      if (!KeyInfoT::isEqual(P->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(P->getFirst(), TombstoneKey))
        P->getSecond().~ValueT();
      P->getFirst().~KeyT();
    }
  }